

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

void ImStb::stb_textedit_delete(ImGuiInputTextState *str,STB_TexteditState *state,int where,int len)

{
  ImWchar *pIVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  pIVar1 = stb_text_createundo(&state->undostate,where,len,0);
  if (pIVar1 != (ImWchar *)0x0) {
    uVar2 = 0;
    if (0 < len) {
      uVar2 = (ulong)(uint)len;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      pIVar1[uVar3] = (str->TextW).Data[(long)where + uVar3];
    }
  }
  STB_TEXTEDIT_DELETECHARS(str,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}